

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall
capnp::Orphan<capnp::DynamicStruct>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  RawBrandedSchema *pRVar1;
  StructSize size;
  StructSchema unaff_RBX;
  
  pRVar1 = (this->schema).super_Schema.raw;
  size = anon_unknown_71::structSizeFromSchema(unaff_RBX);
  _::OrphanBuilder::asStructReader(&__return_storage_ptr__->reader,&this->builder,size);
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Reader Orphan<DynamicStruct>::getReader() const {
  return DynamicStruct::Reader(schema, builder.asStructReader(structSizeFromSchema(schema)));
}